

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O0

Move * zddSwapAny(DdManager *table,int x,int y)

{
  DdNode *pDVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  DdHalfWord DVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  uint local_4c;
  DdHalfWord local_48;
  int limit_size;
  int y_next;
  int x_next;
  int y_ref;
  int x_ref;
  int size;
  int tmp;
  Move *moves;
  Move *move;
  int y_local;
  int x_local;
  DdManager *table_local;
  
  move._0_4_ = y;
  move._4_4_ = x;
  if (y < x) {
    move._0_4_ = x;
    move._4_4_ = y;
  }
  DVar3 = move._4_4_;
  DVar2 = (DdHalfWord)move;
  limit_size = cuddZddNextHigh(table,move._4_4_);
  local_48 = cuddZddNextLow(table,(DdHalfWord)move);
  _size = (DdNode *)0x0;
  local_4c = table->keysZ;
  while( true ) {
    DVar4 = move._4_4_;
    pDVar1 = _size;
    if (limit_size == local_48) {
      iVar5 = cuddZddSwapInPlace(table,move._4_4_,limit_size);
      if ((iVar5 == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0))
      goto LAB_00a81c17;
      pDVar6->index = move._4_4_;
      pDVar6->ref = limit_size;
      *(int *)((long)&pDVar6->next + 4) = iVar5;
      (pDVar6->type).kids.T = _size;
      iVar5 = cuddZddSwapInPlace(table,local_48,(DdHalfWord)move);
      pDVar1 = pDVar6;
      if ((iVar5 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
      goto LAB_00a81c17;
      pDVar7->index = local_48;
      pDVar7->ref = (DdHalfWord)move;
      *(int *)((long)&pDVar7->next + 4) = iVar5;
      (pDVar7->type).kids.T = pDVar6;
      y_ref = cuddZddSwapInPlace(table,move._4_4_,limit_size);
      pDVar1 = pDVar7;
      if ((y_ref == 0) || (_size = cuddDynamicAllocNode(table), _size == (DdNode *)0x0))
      goto LAB_00a81c17;
      _size->index = move._4_4_;
      _size->ref = limit_size;
      *(int *)((long)&_size->next + 4) = y_ref;
      (_size->type).kids.T = pDVar7;
      move._4_4_ = (DdHalfWord)move;
      move._0_4_ = DVar4;
    }
    else if (move._4_4_ == local_48) {
      y_ref = cuddZddSwapInPlace(table,move._4_4_,limit_size);
      if ((y_ref == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0))
      goto LAB_00a81c17;
      pDVar6->index = move._4_4_;
      pDVar6->ref = limit_size;
      *(int *)((long)&pDVar6->next + 4) = y_ref;
      (pDVar6->type).kids.T = _size;
      move._4_4_ = (DdHalfWord)move;
      move._0_4_ = DVar4;
      _size = pDVar6;
    }
    else {
      iVar5 = cuddZddSwapInPlace(table,move._4_4_,limit_size);
      if ((iVar5 == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0))
      goto LAB_00a81c17;
      pDVar6->index = move._4_4_;
      pDVar6->ref = limit_size;
      *(int *)((long)&pDVar6->next + 4) = iVar5;
      (pDVar6->type).kids.T = _size;
      y_ref = cuddZddSwapInPlace(table,local_48,(DdHalfWord)move);
      pDVar1 = pDVar6;
      if ((y_ref == 0) || (_size = cuddDynamicAllocNode(table), _size == (DdNode *)0x0))
      goto LAB_00a81c17;
      _size->index = local_48;
      _size->ref = (DdHalfWord)move;
      *(int *)((long)&_size->next + 4) = y_ref;
      (_size->type).kids.T = pDVar6;
      move._4_4_ = limit_size;
      move._0_4_ = local_48;
    }
    limit_size = cuddZddNextHigh(table,move._4_4_);
    local_48 = cuddZddNextLow(table,(DdHalfWord)move);
    if (((int)DVar2 < limit_size) || (table->maxGrowth * (double)(int)local_4c < (double)y_ref))
    break;
    if (y_ref < (int)local_4c) {
      local_4c = y_ref;
    }
  }
  if ((int)DVar3 <= (int)local_48) {
    iVar5 = cuddZddSwapInPlace(table,local_48,(DdHalfWord)move);
    pDVar1 = _size;
    if ((iVar5 == 0) || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0)) {
LAB_00a81c17:
      while (_size = pDVar1, _size != (DdNode *)0x0) {
        pDVar1 = (_size->type).kids.T;
        _size->ref = 0;
        _size->next = table->nextFree;
        table->nextFree = _size;
      }
      return (Move *)0x0;
    }
    pDVar6->index = local_48;
    pDVar6->ref = (DdHalfWord)move;
    *(int *)((long)&pDVar6->next + 4) = iVar5;
    (pDVar6->type).kids.T = _size;
    _size = pDVar6;
  }
  return (Move *)_size;
}

Assistant:

static Move *
zddSwapAny(
  DdManager * table,
  int  x,
  int  y)
{
    Move        *move, *moves;
    int         tmp, size;
    int         x_ref, y_ref;
    int         x_next, y_next;
    int         limit_size;

    if (x > y) {        /* make x precede y */
        tmp = x; x = y; y = tmp;
    }

    x_ref = x; y_ref = y;

    x_next = cuddZddNextHigh(table, x);
    y_next = cuddZddNextLow(table, y);
    moves = NULL;
    limit_size = table->keysZ;

    for (;;) {
        if (x_next == y_next) { /* x < x_next = y_next < y */
            size = cuddZddSwapInPlace(table, x, x_next);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *) cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = x;
            move->y = x_next;
            move->size = size;
            move->next = moves;
            moves = move;

            size = cuddZddSwapInPlace(table, y_next, y);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = y_next;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;

            size = cuddZddSwapInPlace(table, x, x_next);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = x;
            move->y = x_next;
            move->size = size;
            move->next = moves;
            moves = move;

            tmp = x; x = y; y = tmp;

        } else if (x == y_next) { /* x = y_next < y = x_next */
            size = cuddZddSwapInPlace(table, x, x_next);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = x;
            move->y = x_next;
            move->size = size;
            move->next = moves;
            moves = move;

            tmp = x; x = y;  y = tmp;
        } else {
            size = cuddZddSwapInPlace(table, x, x_next);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = x;
            move->y = x_next;
            move->size = size;
            move->next = moves;
            moves = move;

            size = cuddZddSwapInPlace(table, y_next, y);
            if (size == 0)
                goto zddSwapAnyOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto zddSwapAnyOutOfMem;
            move->x = y_next;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;

            x = x_next; y = y_next;
        }

        x_next = cuddZddNextHigh(table, x);
        y_next = cuddZddNextLow(table, y);
        if (x_next > y_ref)
            break;      /* if x == y_ref */

        if ((double) size > table->maxGrowth * (double) limit_size)
            break;
        if (size < limit_size)
            limit_size = size;
    }
    if (y_next >= x_ref) {
        size = cuddZddSwapInPlace(table, y_next, y);
        if (size == 0)
            goto zddSwapAnyOutOfMem;
        move = (Move *)cuddDynamicAllocNode(table);
        if (move == NULL)
            goto zddSwapAnyOutOfMem;
        move->x = y_next;
        move->y = y;
        move->size = size;
        move->next = moves;
        moves = move;
    }

    return(moves);

zddSwapAnyOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(NULL);

}